

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

bool TranslateToC(CompilerContext *ctx,char *fileName,char *mainName,
                 _func_void_char_ptr *addDependency)

{
  _func_void_void_ptr *p_Var1;
  bool bVar2;
  int iVar3;
  void *pvVar4;
  char **ppcVar5;
  uint i;
  uint index;
  TraceScope traceScope;
  SmallArray<const_char_*,_32U> dependencies;
  TraceScope local_2e0;
  SmallArray<const_char_*,_32U> local_2d0;
  ExpressionTranslateContext local_1b8;
  
  if (TranslateToC(CompilerContext&,char_const*,char_const*,void(*)(char_const*))::token == '\0') {
    iVar3 = __cxa_guard_acquire(&TranslateToC(CompilerContext&,char_const*,char_const*,void(*)(char_const*))
                                 ::token);
    if (iVar3 != 0) {
      TranslateToC::token = NULLC::TraceGetToken("compiler","TranslateToC");
      __cxa_guard_release(&TranslateToC(CompilerContext&,char_const*,char_const*,void(*)(char_const*))
                           ::token);
    }
  }
  NULLC::TraceScope::TraceScope(&local_2e0,TranslateToC::token);
  if ((ctx->outputCtx).stream == (void *)0x0) {
    pvVar4 = (*(ctx->outputCtx).openStream)(fileName);
    (ctx->outputCtx).stream = pvVar4;
    if (pvVar4 == (void *)0x0) {
      bVar2 = false;
      NULLC::SafeSprintf(ctx->errorBuf,(ulong)ctx->errorBufSize,"ERROR: failed to open file");
    }
    else {
      local_1b8.output = &ctx->outputCtx;
      local_1b8.ctx = &ctx->exprCtx;
      local_2d0.allocator = ctx->allocator;
      local_1b8.loopBreakIdStack.data = local_1b8.loopBreakIdStack.little;
      local_1b8.loopBreakIdStack.count = 0;
      local_1b8.loopBreakIdStack.max = 0x20;
      local_1b8.loopContinueIdStack.data = local_1b8.loopContinueIdStack.little;
      local_1b8.loopContinueIdStack.count = 0;
      local_1b8.loopContinueIdStack.max = 0x20;
      local_1b8.indent = "\t";
      local_1b8.errorPos = (char *)0x0;
      local_1b8.nextLoopBreakId = 1;
      local_1b8.nextLoopContinueId = 1;
      local_1b8.nextReturnValueId = 1;
      local_1b8.skipFunctionDefinitions = false;
      local_1b8.currentFunction = (FunctionData *)0x0;
      local_1b8.errorBuf = ctx->errorBuf;
      local_1b8.depth = 0;
      local_1b8.errorBufSize = ctx->errorBufSize;
      local_2d0.data = local_2d0.little;
      local_2d0.count = 0;
      local_2d0.max = 0x20;
      local_1b8.mainName = mainName;
      local_1b8.loopBreakIdStack.allocator = local_2d0.allocator;
      local_1b8.loopContinueIdStack.allocator = local_2d0.allocator;
      local_1b8.allocator = local_2d0.allocator;
      bVar2 = TranslateModule(&local_1b8,ctx->exprModule,&local_2d0);
      pvVar4 = (ctx->outputCtx).stream;
      p_Var1 = (ctx->outputCtx).closeStream;
      if (bVar2) {
        (*p_Var1)(pvVar4);
        (ctx->outputCtx).stream = (void *)0x0;
        if (addDependency != (_func_void_char_ptr *)0x0) {
          for (index = 0; index < local_2d0.count; index = index + 1) {
            ppcVar5 = SmallArray<const_char_*,_32U>::operator[](&local_2d0,index);
            (*addDependency)(*ppcVar5);
          }
        }
      }
      else {
        (*p_Var1)(pvVar4);
        (ctx->outputCtx).stream = (void *)0x0;
      }
      SmallArray<const_char_*,_32U>::~SmallArray(&local_2d0);
      ExpressionTranslateContext::~ExpressionTranslateContext(&local_1b8);
    }
    NULLC::TraceScope::~TraceScope(&local_2e0);
    return bVar2;
  }
  __assert_fail("!ctx.outputCtx.stream",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Compiler.cpp"
                ,0x7f2,
                "bool TranslateToC(CompilerContext &, const char *, const char *, void (*)(const char *))"
               );
}

Assistant:

bool TranslateToC(CompilerContext &ctx, const char *fileName, const char *mainName, void (*addDependency)(const char *fileName))
{
	TRACE_SCOPE("compiler", "TranslateToC");

	assert(!ctx.outputCtx.stream);
	ctx.outputCtx.stream = ctx.outputCtx.openStream(fileName);

	if(!ctx.outputCtx.stream)
	{
		NULLC::SafeSprintf(ctx.errorBuf, ctx.errorBufSize, "ERROR: failed to open file");
		return false;
	}

	ExpressionTranslateContext exprTranslateCtx(ctx.exprCtx, ctx.outputCtx, ctx.allocator);

	exprTranslateCtx.mainName = mainName;

	exprTranslateCtx.errorBuf = ctx.errorBuf;
	exprTranslateCtx.errorBufSize = ctx.errorBufSize;

	SmallArray<const char*, 32> dependencies(ctx.allocator);

	if(!TranslateModule(exprTranslateCtx, ctx.exprModule, dependencies))
	{
		ctx.outputCtx.closeStream(ctx.outputCtx.stream);
		ctx.outputCtx.stream = NULL;

		return false;
	}

	ctx.outputCtx.closeStream(ctx.outputCtx.stream);
	ctx.outputCtx.stream = NULL;

	if(addDependency)
	{
		for(unsigned i = 0; i < dependencies.size(); i++)
			addDependency(dependencies[i]);
	}

	return true;
}